

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronous_factory.h
# Opt level: O0

shared_ptr<spdlog::logger>
spdlog::synchronous_factory::create<spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>>
          (string *logger_name)

{
  registry *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  shared_ptr<spdlog::logger> *in_stack_00000038;
  registry *in_stack_00000040;
  shared_ptr<spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>_> sink;
  shared_ptr<spdlog::logger> *new_logger;
  shared_ptr<spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>_> *__args_1;
  element_type *in_stack_ffffffffffffffb8;
  shared_ptr<spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>_> local_20 [2];
  
  __args_1 = local_20;
  std::make_shared<spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>>();
  std::
  make_shared<spdlog::logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb8,__args_1);
  this = details::registry::instance();
  std::shared_ptr<spdlog::logger>::shared_ptr
            ((shared_ptr<spdlog::logger> *)this,
             (shared_ptr<spdlog::logger> *)&stack0xffffffffffffffb8);
  details::registry::initialize_logger(in_stack_00000040,in_stack_00000038);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x284043);
  std::shared_ptr<spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>_>::~shared_ptr
            ((shared_ptr<spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>_> *)0x28409f
            );
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<spdlog::logger> create(std::string logger_name, SinkArgs &&...args) {
        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<spdlog::logger>(std::move(logger_name), std::move(sink));
        details::registry::instance().initialize_logger(new_logger);
        return new_logger;
    }